

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O0

int64_t PredictionCostBias(uint32_t *counts,uint64_t weight_0,uint64_t exp_val)

{
  int64_t iVar1;
  long in_RDX;
  long in_RSI;
  uint *in_RDI;
  int i;
  uint64_t bits;
  uint64_t exp_decay_factor;
  int significant_symbols;
  int local_34;
  long local_30;
  long local_18;
  
  local_30 = in_RSI * (ulong)*in_RDI * 0x800000;
  local_18 = in_RDX << 0x17;
  for (local_34 = 1; local_34 < 0x10; local_34 = local_34 + 1) {
    iVar1 = DivRound(local_18 * (ulong)(in_RDI[local_34] + in_RDI[0x100 - local_34]),100);
    local_30 = iVar1 + local_30;
    local_18 = DivRound(local_18 * 6,10);
  }
  iVar1 = DivRound(local_30,10);
  return -iVar1;
}

Assistant:

static int64_t PredictionCostBias(const uint32_t counts[256], uint64_t weight_0,
                                  uint64_t exp_val) {
  const int significant_symbols = 256 >> 4;
  const uint64_t exp_decay_factor = 6;  // has a scaling factor of 1/10
  uint64_t bits = (weight_0 * counts[0]) << LOG_2_PRECISION_BITS;
  int i;
  exp_val <<= LOG_2_PRECISION_BITS;
  for (i = 1; i < significant_symbols; ++i) {
    bits += DivRound(exp_val * (counts[i] + counts[256 - i]), 100);
    exp_val = DivRound(exp_decay_factor * exp_val, 10);
  }
  return -DivRound((int64_t)bits, 10);
}